

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cBufferStorageTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::BufferStorage::GetBufferParameterTest::iterate(GetBufferParameterTest *this)

{
  ostringstream *poVar1;
  GLenum flags;
  GLenum access;
  Context *pCVar2;
  pointer ptVar3;
  int iVar4;
  undefined4 extraout_var;
  MessageBuilder *pMVar5;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  bool bVar6;
  uint uVar7;
  ulong uVar8;
  MoveMapOwner MVar9;
  GLint queried_flags;
  GLint queried_access;
  GLint queried_size;
  GLint queried_immutable;
  Buffer buffer;
  MapOwner tmp;
  undefined1 local_1b0 [384];
  Functions *gl;
  
  BufferStorage::Buffer::LoadExtDirectStateAccess((this->super_TestCase).m_context);
  pCVar2 = (this->super_TestCase).m_context;
  if (m_direct_state_access_support == 0) {
    this_00 = pCVar2->m_testCtx;
    description = "Unsupported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  else {
    iVar4 = (*pCVar2->m_renderCtx->_vptr_RenderContext[3])();
    gl = (Functions *)CONCAT44(extraout_var,iVar4);
    uVar7 = 0;
    bVar6 = true;
    while( true ) {
      uVar8 = (ulong)uVar7;
      ptVar3 = (this->m_test_cases).
               super__Vector_base<gl4cts::BufferStorage::GetBufferParameterTest::testCase,_std::allocator<gl4cts::BufferStorage::GetBufferParameterTest::testCase>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->m_test_cases).
                        super__Vector_base<gl4cts::BufferStorage::GetBufferParameterTest::testCase,_std::allocator<gl4cts::BufferStorage::GetBufferParameterTest::testCase>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ptVar3 >> 3) <= uVar8)
      break;
      flags = ptVar3[uVar8].m_flags;
      access = ptVar3[uVar8].m_access;
      queried_flags = -1;
      queried_immutable = -1;
      queried_size = -1;
      buffer.m_context = (this->super_TestCase).m_context;
      buffer.m_id = 0xffffffff;
      buffer.m_target = 0x8892;
      BufferStorage::Buffer::InitStorage(&buffer,0x8892,flags,0x20,iterate::data);
      BufferStorage::Buffer::Bind(gl,buffer.m_id,0x8892);
      if (gl->getNamedBufferParameteriv != (glGetNamedBufferParameterivFunc)0x0) {
        BufferStorage::Buffer::GetNamedParameter(gl,buffer.m_id,0x8220,&queried_flags);
        BufferStorage::Buffer::GetNamedParameter(gl,buffer.m_id,0x821f,&queried_immutable);
        BufferStorage::Buffer::GetNamedParameter(gl,buffer.m_id,0x8764,&queried_size);
        if (queried_flags != flags) {
          local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
          poVar1 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::operator<<((ostream *)poVar1,
                          "GetNamedBufferParameteriv reported invalid state of GL_BUFFER_STORAGE_FLAGS: "
                         );
          std::ostream::operator<<(poVar1,queried_flags);
          std::operator<<((ostream *)poVar1," expected: ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          bVar6 = false;
        }
      }
      if (queried_flags != flags) {
        local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,
                        "GetNamedBufferParameteriv reported invalid state of GL_BUFFER_STORAGE_FLAGS: "
                       );
        std::ostream::operator<<(poVar1,queried_flags);
        std::operator<<((ostream *)poVar1," expected: ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        bVar6 = false;
      }
      if (queried_immutable != 1) {
        local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,
                        "GetNamedBufferParameteriv reported invalid state of GL_BUFFER_IMMUTABLE_STORAGE: "
                       );
        std::ostream::operator<<(poVar1,queried_immutable);
        std::operator<<((ostream *)poVar1," expected: ");
        std::ostream::operator<<(poVar1,1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        bVar6 = false;
      }
      if (queried_size != 0x20) {
        local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,
                        "GetNamedBufferParameteriv reported invalid state of GL_BUFFER_SIZE: ");
        std::ostream::operator<<(poVar1,queried_size);
        std::operator<<((ostream *)poVar1," expected: ");
        pMVar5 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,&iterate::data_size);
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        bVar6 = false;
      }
      queried_flags = -1;
      queried_immutable = -1;
      queried_size = -1;
      BufferStorage::Buffer::GetParameter(gl,0x8892,0x8220,&queried_flags);
      BufferStorage::Buffer::GetParameter(gl,0x8892,0x821f,&queried_immutable);
      BufferStorage::Buffer::GetParameter(gl,0x8892,0x8764,&queried_size);
      if (queried_flags != flags) {
        local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,
                        "GetBufferParameteriv reported invalid state of GL_BUFFER_STORAGE_FLAGS: ");
        std::ostream::operator<<(poVar1,queried_flags);
        std::operator<<((ostream *)poVar1," expected: ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        bVar6 = false;
      }
      if (queried_immutable != 1) {
        local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,
                        "GetBufferParameteriv reported invalid state of GL_BUFFER_IMMUTABLE_STORAGE: "
                       );
        std::ostream::operator<<(poVar1,queried_immutable);
        std::operator<<((ostream *)poVar1," expected: ");
        std::ostream::operator<<(poVar1,1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        bVar6 = false;
      }
      if (queried_size != 0x20) {
        local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,
                        "GetBufferParameteriv reported invalid state of GL_BUFFER_SIZE: ");
        std::ostream::operator<<(poVar1,queried_size);
        std::operator<<((ostream *)poVar1," expected: ");
        pMVar5 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,&iterate::data_size);
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        bVar6 = false;
      }
      if (access != 0) {
        queried_access = -1;
        MVar9 = BufferStorage::Buffer::MapRange(&buffer,0,0x20,access);
        tmp.m_data = MVar9.data;
        tmp.m_buffer = MVar9.buffer;
        if (gl->getNamedBufferParameteriv != (glGetNamedBufferParameterivFunc)0x0) {
          BufferStorage::Buffer::GetNamedParameter(gl,buffer.m_id,0x911f,&queried_access);
          MVar9.data = tmp.m_data;
          MVar9.buffer = tmp.m_buffer;
        }
        tmp.m_data = MVar9.data;
        tmp.m_buffer = MVar9.buffer;
        if (queried_access != access) {
          local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
          poVar1 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::operator<<((ostream *)poVar1,
                          "GetNamedBufferParameteriv reported invalid state of GL_BUFFER_ACCESS_FLAGS: "
                         );
          std::ostream::operator<<(poVar1,queried_access);
          std::operator<<((ostream *)poVar1," expected: ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          MVar9.data = tmp.m_data;
          MVar9.buffer = tmp.m_buffer;
          bVar6 = false;
        }
        tmp.m_data = MVar9.data;
        tmp.m_buffer = MVar9.buffer;
        queried_access = -1;
        BufferStorage::Buffer::GetParameter(gl,0x8892,0x911f,&queried_access);
        if (queried_access != access) {
          local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
          poVar1 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::operator<<((ostream *)poVar1,
                          "GetBufferParameteriv reported invalid state of GL_BUFFER_ACCESS_FLAGS: ")
          ;
          std::ostream::operator<<(poVar1,queried_access);
          std::operator<<((ostream *)poVar1," expected: ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          bVar6 = false;
        }
        BufferStorage::Buffer::MapOwner::~MapOwner(&tmp);
      }
      BufferStorage::Buffer::Bind(gl,0,0x8892);
      BufferStorage::Buffer::~Buffer(&buffer);
      uVar7 = uVar7 + 1;
    }
    this_00 = ((this->super_TestCase).m_context)->m_testCtx;
    if (bVar6) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GetBufferParameterTest::iterate()
{
	static const GLsizeiptr data_size = 32;
	static GLubyte			data[data_size];

	Buffer::LoadExtDirectStateAccess(m_context);

	// No GL45 or GL_ARB_direct_state_access support
	if (m_direct_state_access_support == FUNCTIONALITY_SUPPORT_NONE)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Unsupported");
		return tcu::TestNode::STOP;
	}

	const Functions& gl = m_context.getRenderContext().getFunctions();

	bool test_result = true;

	for (GLuint i = 0; i < m_test_cases.size(); ++i)
	{
		const testCase& test_case = m_test_cases[i];
		const GLenum	access	= test_case.m_access;
		const GLenum	flags	 = test_case.m_flags;

		GLint queried_flags		= -1;
		GLint queried_immutable = -1;
		GLint queried_size		= -1;

		Buffer buffer(m_context);

		buffer.InitStorage(GL_ARRAY_BUFFER, flags, data_size, data);
		Buffer::Bind(gl, buffer.m_id, GL_ARRAY_BUFFER);

		if (0 != gl.getNamedBufferParameteriv)
		{
			Buffer::GetNamedParameter(gl, buffer.m_id, GL_BUFFER_STORAGE_FLAGS, &queried_flags);
			Buffer::GetNamedParameter(gl, buffer.m_id, GL_BUFFER_IMMUTABLE_STORAGE, &queried_immutable);
			Buffer::GetNamedParameter(gl, buffer.m_id, GL_BUFFER_SIZE, &queried_size);

			if (queried_flags != (GLint)flags)
			{
				test_result = false;
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message
					<< "GetNamedBufferParameteriv reported invalid state of GL_BUFFER_STORAGE_FLAGS: " << queried_flags
					<< " expected: " << flags << tcu::TestLog::EndMessage;
			}
		}

		if (queried_flags != (GLint)flags)
		{
			test_result = false;
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "GetNamedBufferParameteriv reported invalid state of GL_BUFFER_STORAGE_FLAGS: " << queried_flags
				<< " expected: " << flags << tcu::TestLog::EndMessage;
		}

		if (queried_immutable != GL_TRUE)
		{
			test_result = false;
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "GetNamedBufferParameteriv reported invalid state of GL_BUFFER_IMMUTABLE_STORAGE: "
				<< queried_immutable << " expected: " << GL_TRUE << tcu::TestLog::EndMessage;
		}

		if (queried_size != data_size)
		{
			test_result = false;
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "GetNamedBufferParameteriv reported invalid state of GL_BUFFER_SIZE: " << queried_size
				<< " expected: " << data_size << tcu::TestLog::EndMessage;
		}

		queried_flags	 = -1;
		queried_immutable = -1;
		queried_size	  = -1;

		Buffer::GetParameter(gl, GL_ARRAY_BUFFER, GL_BUFFER_STORAGE_FLAGS, &queried_flags);
		Buffer::GetParameter(gl, GL_ARRAY_BUFFER, GL_BUFFER_IMMUTABLE_STORAGE, &queried_immutable);
		Buffer::GetParameter(gl, GL_ARRAY_BUFFER, GL_BUFFER_SIZE, &queried_size);

		if (queried_flags != (GLint)flags)
		{
			test_result = false;
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "GetBufferParameteriv reported invalid state of GL_BUFFER_STORAGE_FLAGS: " << queried_flags
				<< " expected: " << flags << tcu::TestLog::EndMessage;
		}

		if (queried_immutable != GL_TRUE)
		{
			test_result = false;
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "GetBufferParameteriv reported invalid state of GL_BUFFER_IMMUTABLE_STORAGE: " << queried_immutable
				<< " expected: " << GL_TRUE << tcu::TestLog::EndMessage;
		}

		if (queried_size != data_size)
		{
			test_result = false;
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "GetBufferParameteriv reported invalid state of GL_BUFFER_SIZE: " << queried_size
				<< " expected: " << data_size << tcu::TestLog::EndMessage;
		}

		if (0 != access)
		{
			GLint queried_access = -1;

			Buffer::MapOwner tmp(buffer.MapRange(0 /* offset */, data_size, access));

			if (0 != gl.getNamedBufferParameteriv)
			{
				Buffer::GetNamedParameter(gl, buffer.m_id, GL_BUFFER_ACCESS_FLAGS, &queried_access);
			}

			if (queried_access != (GLint)access)
			{
				test_result = false;
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message
					<< "GetNamedBufferParameteriv reported invalid state of GL_BUFFER_ACCESS_FLAGS: " << queried_access
					<< " expected: " << access << tcu::TestLog::EndMessage;
			}

			queried_access = -1;

			Buffer::GetParameter(gl, GL_ARRAY_BUFFER, GL_BUFFER_ACCESS_FLAGS, &queried_access);

			if (queried_access != (GLint)access)
			{
				test_result = false;
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message
					<< "GetBufferParameteriv reported invalid state of GL_BUFFER_ACCESS_FLAGS: " << queried_access
					<< " expected: " << access << tcu::TestLog::EndMessage;
			}
		}

		Buffer::Bind(gl, 0 /* id */, GL_ARRAY_BUFFER);
	}

	/* Set result */
	if (true == test_result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}